

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_free_hash_table.h
# Opt level: O2

DataNode *
neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::Locator::NewDataNode
          (LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL> *ht,int *key,int *mapped)

{
  int iVar1;
  DataNode *pDVar2;
  uint32_t uVar3;
  ulong uVar4;
  DataNode *pDVar5;
  pointer pNVar6;
  pointer pNVar7;
  
  uVar3 = FASTER::core::Thread::id();
  uVar4 = (ulong)uVar3;
  pNVar6 = (ht->data_pool_).
           super__Vector_base<NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 <= (ulong)((long)(ht->data_pool_).
                             super__Vector_base<NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar6 >> 4)) {
    if (pNVar6[uVar4].head_ == (DataNode *)0x0) {
      pDVar5 = (DataNode *)operator_new(0x30);
      (pDVar5->super_Node).type = Data;
      (pDVar5->super_Node)._vptr_Node = (_func_int **)&PTR__Node_00107cc8;
      iVar1 = *key;
      (pDVar5->data).key = iVar1;
      (pDVar5->data).mapped = *mapped;
      (pDVar5->data).hash = (long)iVar1;
      pDVar5->next = (DataNode *)0x0;
      pDVar5->last = (DataNode *)0x0;
    }
    else {
      pNVar6 = pNVar6 + uVar4;
      pDVar5 = pNVar6->tail_;
      pDVar2 = pDVar5->last;
      pNVar7 = (pointer)&pDVar2->next;
      if (pDVar2 == (DataNode *)0x0) {
        pNVar7 = pNVar6;
      }
      pNVar6->tail_ = pDVar2;
      pNVar7->head_ = (DataNode *)0x0;
      (pDVar5->super_Node).type = Data;
      (pDVar5->data).key = *key;
      (pDVar5->data).mapped = *mapped;
      (pDVar5->data).hash = (long)*key;
    }
    return pDVar5;
  }
  __assert_fail("tid <= ht.data_pool_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/test/../neatlib/lock_free_hash_table.h"
                ,99,
                "static DataNode *neatlib::LockFreeHashTable<int, int>::Locator::NewDataNode(LockFreeHashTable<Key, T, Hash, HASH_LEVEL, ROOT_HASH_LEVEL> &, const Key &, const T &) [Key = int, T = int, Hash = std::hash<int>, HASH_LEVEL = 4, ROOT_HASH_LEVEL = 4]"
               );
}

Assistant:

inline static DataNode *NewDataNode(LockFreeHashTable &ht, const Key &key, const T &mapped) {
            uint32_t tid = FASTER::core::Thread::id();
            assert(tid <= ht.data_pool_.size());
            DataNodeQueue &queue = ht.data_pool_[tid];
            if (!queue.Empty()) {
                DataNode *ptr = queue.Pop();
                ptr->type = NodeType::Data;
                ptr->data.init(key, mapped);
                return ptr;
            }
            return new DataNode(key, mapped);
        }